

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O3

void __thiscall Wasm::WasmBytecodeGenerator::EmitExpr(WasmBytecodeGenerator *this,WasmOp op)

{
  FunctionBody *pFVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  RegSlot RVar5;
  uint32 uVar6;
  undefined4 *puVar7;
  EmitInfo info;
  FunctionInfo *pFVar8;
  _func_int **pp_Var9;
  WasmBinaryReader *pWVar10;
  RegisterSpace *this_00;
  WasmCompilationException *this_01;
  ViewType VVar11;
  uint32 *puVar12;
  undefined1 *puVar13;
  WasmType *pWVar14;
  OpCodeAsmJs OVar16;
  WasmOp WVar17;
  WasmType type;
  undefined8 uVar18;
  IWasmByteCodeWriter *pIVar19;
  WasmConstLitNode cnst;
  PolymorphicEmitInfo PVar20;
  PolymorphicEmitInfo local_40;
  WasmBlock WVar15;
  
  pFVar1 = (this->m_funcInfo->m_body).ptr;
  if (pFVar1 == (FunctionBody *)0x0) {
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,WasmBytecodePhase);
  }
  else {
    uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar1);
    pFVar1 = (this->m_funcInfo->m_body).ptr;
    pFVar8 = (pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    if (pFVar8 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/../Runtime/Base/FunctionBody.h"
                         ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar3) goto LAB_00f1f714;
      *puVar7 = 0;
      pFVar8 = (pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    }
    bVar3 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_015b6718,WasmBytecodePhase,uVar4,pFVar8->functionId);
  }
  if (bVar3 != false) {
    PrintOpBegin(this,op);
  }
  switch(op) {
  case wbI32AtomicLoad:
    bVar3 = Threads::IsEnabled();
    if (!bVar3) {
      this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
      WasmCompilationException::WasmCompilationException
                (this_01,L"Operator %s is Not Yet Implemented",L"i32.atomic.load");
      break;
    }
    pWVar14 = (WasmType *)&WasmOpCodeSignatures::I_I;
    WVar17 = wbI32AtomicLoad;
    VVar11 = TYPE_INT32;
    goto LAB_00f1db5a;
  case wbI64AtomicLoad:
    bVar3 = Threads::IsEnabled();
    if (!bVar3) {
      this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
      WasmCompilationException::WasmCompilationException
                (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.load");
      break;
    }
    pWVar14 = (WasmType *)&WasmOpCodeSignatures::L_I;
    WVar17 = wbI64AtomicLoad;
    VVar11 = TYPE_INT64;
    goto LAB_00f1db5a;
  case wbI32AtomicLoad8U:
    bVar3 = Threads::IsEnabled();
    if (!bVar3) {
      this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
      WasmCompilationException::WasmCompilationException
                (this_01,L"Operator %s is Not Yet Implemented",L"i32.atomic.load8_u");
      break;
    }
    pWVar14 = (WasmType *)&WasmOpCodeSignatures::I_I;
    WVar17 = wbI32AtomicLoad8U;
    VVar11 = TYPE_UINT8;
    goto LAB_00f1db5a;
  case wbI32AtomicLoad16U:
    bVar3 = Threads::IsEnabled();
    if (!bVar3) {
      this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
      WasmCompilationException::WasmCompilationException
                (this_01,L"Operator %s is Not Yet Implemented",L"i32.atomic.load16_u");
      break;
    }
    pWVar14 = (WasmType *)&WasmOpCodeSignatures::I_I;
    WVar17 = wbI32AtomicLoad16U;
    VVar11 = TYPE_UINT16;
    goto LAB_00f1db5a;
  case wbI64AtomicLoad8U:
    bVar3 = Threads::IsEnabled();
    if (!bVar3) {
      this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
      WasmCompilationException::WasmCompilationException
                (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.load8_u");
      break;
    }
    pWVar14 = (WasmType *)&WasmOpCodeSignatures::L_I;
    WVar17 = wbI64AtomicLoad8U;
    VVar11 = TYPE_UINT8_TO_INT64;
    goto LAB_00f1db5a;
  case wbI64AtomicLoad16U:
    bVar3 = Threads::IsEnabled();
    if (!bVar3) {
      this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
      WasmCompilationException::WasmCompilationException
                (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.load16_u");
      break;
    }
    pWVar14 = (WasmType *)&WasmOpCodeSignatures::L_I;
    WVar17 = wbI64AtomicLoad16U;
    VVar11 = TYPE_UINT16_TO_INT64;
    goto LAB_00f1db5a;
  case wbI64AtomicLoad32U:
    bVar3 = Threads::IsEnabled();
    if (!bVar3) {
      this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
      WasmCompilationException::WasmCompilationException
                (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.load32_u");
      break;
    }
    pWVar14 = (WasmType *)&WasmOpCodeSignatures::L_I;
    WVar17 = wbI64AtomicLoad32U;
    VVar11 = TYPE_UINT32_TO_INT64;
LAB_00f1db5a:
    info = EmitMemAccess<false,true>(this,WVar17,pWVar14,VVar11);
    goto LAB_00f1dbbb;
  case wbI32AtomicStore:
    bVar3 = Threads::IsEnabled();
    if (!bVar3) {
      this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
      WasmCompilationException::WasmCompilationException
                (this_01,L"Operator %s is Not Yet Implemented",L"i32.atomic.store");
      break;
    }
    puVar13 = WasmOpCodeSignatures::I_II;
    WVar17 = wbI32AtomicStore;
    VVar11 = TYPE_INT32;
    goto LAB_00f1dba5;
  case wbI64AtomicStore:
    bVar3 = Threads::IsEnabled();
    if (!bVar3) {
      this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
      WasmCompilationException::WasmCompilationException
                (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.store");
      break;
    }
    puVar13 = WasmOpCodeSignatures::L_IL;
    WVar17 = wbI64AtomicStore;
    VVar11 = TYPE_INT64;
    goto LAB_00f1dba5;
  case wbI32AtomicStore8:
    bVar3 = Threads::IsEnabled();
    if (!bVar3) {
      this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
      WasmCompilationException::WasmCompilationException
                (this_01,L"Operator %s is Not Yet Implemented",L"i32.atomic.store8");
      break;
    }
    puVar13 = WasmOpCodeSignatures::I_II;
    WVar17 = wbI32AtomicStore8;
    VVar11 = TYPE_INT8;
    goto LAB_00f1dba5;
  case wbI32AtomicStore16:
    bVar3 = Threads::IsEnabled();
    if (!bVar3) {
      this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
      WasmCompilationException::WasmCompilationException
                (this_01,L"Operator %s is Not Yet Implemented",L"i32.atomic.store16");
      break;
    }
    puVar13 = WasmOpCodeSignatures::I_II;
    WVar17 = wbI32AtomicStore16;
    VVar11 = TYPE_INT16;
    goto LAB_00f1dba5;
  case wbI64AtomicStore8:
    bVar3 = Threads::IsEnabled();
    if (!bVar3) {
      this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
      WasmCompilationException::WasmCompilationException
                (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.store8");
      break;
    }
    puVar13 = WasmOpCodeSignatures::L_IL;
    WVar17 = wbI64AtomicStore8;
    VVar11 = TYPE_INT8_TO_INT64;
    goto LAB_00f1dba5;
  case wbI64AtomicStore16:
    bVar3 = Threads::IsEnabled();
    if (!bVar3) {
      this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
      WasmCompilationException::WasmCompilationException
                (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.store16");
      break;
    }
    puVar13 = WasmOpCodeSignatures::L_IL;
    WVar17 = wbI64AtomicStore16;
    VVar11 = TYPE_INT16_TO_INT64;
    goto LAB_00f1dba5;
  case wbI64AtomicStore32:
    bVar3 = Threads::IsEnabled();
    if (!bVar3) {
      this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
      WasmCompilationException::WasmCompilationException
                (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.store32");
      break;
    }
    puVar13 = WasmOpCodeSignatures::L_IL;
    WVar17 = wbI64AtomicStore32;
    VVar11 = TYPE_INT32_TO_INT64;
LAB_00f1dba5:
    info = EmitMemAccess<true,true>(this,WVar17,(WasmType *)puVar13,VVar11);
    goto LAB_00f1dbbb;
  case wbI32AtomicRmwAdd:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i32.atomic.rmw.add");
    break;
  case wbI64AtomicRmwAdd:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.rmw.add");
    break;
  case wbI32AtomicRmw8UAdd:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i32.atomic.rmw8_u.add");
    break;
  case wbI32AtomicRmw16UAdd:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i32.atomic.rmw16_u.add");
    break;
  case wbI64AtomicRmw8UAdd:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.rmw8_u.add");
    break;
  case wbI64AtomicRmw16UAdd:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.rmw16_u.add");
    break;
  case wbI64AtomicRmw32UAdd:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.rmw32_u.add");
    break;
  case wbI32AtomicRmwSub:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i32.atomic.rmw.sub");
    break;
  case wbI64AtomicRmwSub:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.rmw.sub");
    break;
  case wbI32AtomicRmw8USub:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i32.atomic.rmw8_u.sub");
    break;
  case wbI32AtomicRmw16USub:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i32.atomic.rmw16_u.sub");
    break;
  case wbI64AtomicRmw8USub:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.rmw8_u.sub");
    break;
  case wbI64AtomicRmw16USub:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.rmw16_u.sub");
    break;
  case wbI64AtomicRmw32USub:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.rmw32_u.sub");
    break;
  case wbI32AtomicRmwAnd:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i32.atomic.rmw.and");
    break;
  case wbI64AtomicRmwAnd:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.rmw.and");
    break;
  case wbI32AtomicRmw8UAnd:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i32.atomic.rmw8_u.and");
    break;
  case wbI32AtomicRmw16UAnd:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i32.atomic.rmw16_u.and");
    break;
  case wbI64AtomicRmw8UAnd:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.rmw8_u.and");
    break;
  case wbI64AtomicRmw16UAnd:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.rmw16_u.and");
    break;
  case wbI64AtomicRmw32UAnd:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.rmw32_u.and");
    break;
  case wbI32AtomicRmwOr:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i32.atomic.rmw.or");
    break;
  case wbI64AtomicRmwOr:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.rmw.or");
    break;
  case wbI32AtomicRmw8UOr:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i32.atomic.rmw8_u.or");
    break;
  case wbI32AtomicRmw16UOr:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i32.atomic.rmw16_u.or");
    break;
  case wbI64AtomicRmw8UOr:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.rmw8_u.or");
    break;
  case wbI64AtomicRmw16UOr:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.rmw16_u.or");
    break;
  case wbI64AtomicRmw32UOr:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.rmw32_u.or");
    break;
  case wbI32AtomicRmwXor:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i32.atomic.rmw.xor");
    break;
  case wbI64AtomicRmwXor:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.rmw.xor");
    break;
  case wbI32AtomicRmw8UXor:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i32.atomic.rmw8_u.xor");
    break;
  case wbI32AtomicRmw16UXor:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i32.atomic.rmw16_u.xor");
    break;
  case wbI64AtomicRmw8UXor:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.rmw8_u.xor");
    break;
  case wbI64AtomicRmw16UXor:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.rmw16_u.xor");
    break;
  case wbI64AtomicRmw32UXor:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.rmw32_u.xor");
    break;
  case wbI32AtomicRmwXchg:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i32.atomic.rmw.xchg");
    break;
  case wbI64AtomicRmwXchg:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.rmw.xchg");
    break;
  case wbI32AtomicRmw8UXchg:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i32.atomic.rmw8_u.xchg");
    break;
  case wbI32AtomicRmw16UXchg:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i32.atomic.rmw16_u.xchg");
    break;
  case wbI64AtomicRmw8UXchg:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.rmw8_u.xchg");
    break;
  case wbI64AtomicRmw16UXchg:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.rmw16_u.xchg");
    break;
  case wbI64AtomicRmw32UXchg:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.rmw32_u.xchg");
    break;
  case wbI32AtomicRmwCmpxchg:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i32.atomic.rmw.cmpxchg");
    break;
  case wbI64AtomicRmwCmpxchg:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.rmw.cmpxchg");
    break;
  case wbI32AtomicRmw8UCmpxchg:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i32.atomic.rmw8_u.cmpxchg");
    break;
  case wbI32AtomicRmw16UCmpxchg:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i32.atomic.rmw16_u.cmpxchg");
    break;
  case wbI64AtomicRmw8UCmpxchg:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.rmw8_u.cmpxchg");
    break;
  case wbI64AtomicRmw16UCmpxchg:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.rmw16_u.cmpxchg");
    break;
  case wbI64AtomicRmw32UCmpxchg:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.rmw32_u.cmpxchg");
    break;
  default:
    switch(op - 0xfc00) {
    case 0:
      bVar3 = WasmNontrapping::IsEnabled();
      if (!bVar3) {
        this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
        WasmCompilationException::WasmCompilationException
                  (this_01,L"Operator %s is Not Yet Implemented",L"i32.trunc_s:sat/f32");
        goto LAB_00f20380;
      }
switchD_00f1dd8f_caseD_0:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::I_F;
      OVar16 = Conv_Sat_FTI;
      goto LAB_00f1dae9;
    case 1:
      bVar3 = WasmNontrapping::IsEnabled();
      if (!bVar3) {
        this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
        WasmCompilationException::WasmCompilationException
                  (this_01,L"Operator %s is Not Yet Implemented",L"i32.trunc_u:sat/f32");
        goto LAB_00f20380;
      }
switchD_00f1dd8f_caseD_1:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::I_F;
      OVar16 = Conv_Sat_FTU;
      goto LAB_00f1dae9;
    case 2:
      bVar3 = WasmNontrapping::IsEnabled();
      if (!bVar3) {
        this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
        WasmCompilationException::WasmCompilationException
                  (this_01,L"Operator %s is Not Yet Implemented",L"i32.trunc_s:sat/f64");
        goto LAB_00f20380;
      }
switchD_00f1dd8f_caseD_2:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::I_D;
      OVar16 = Conv_Sat_DTI;
      goto LAB_00f1dae9;
    case 3:
      bVar3 = WasmNontrapping::IsEnabled();
      if (!bVar3) {
        this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
        WasmCompilationException::WasmCompilationException
                  (this_01,L"Operator %s is Not Yet Implemented",L"i32.trunc_u:sat/f64");
        goto LAB_00f20380;
      }
switchD_00f1dd8f_caseD_3:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::I_D;
      OVar16 = Conv_Sat_DTU;
      goto LAB_00f1dae9;
    case 4:
      bVar3 = WasmNontrapping::IsEnabled();
      if (!bVar3) {
        this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
        WasmCompilationException::WasmCompilationException
                  (this_01,L"Operator %s is Not Yet Implemented",L"i64.trunc_s:sat/f32");
        goto LAB_00f20380;
      }
switchD_00f1dd8f_caseD_4:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::L_F;
      OVar16 = Conv_Sat_FTL;
      goto LAB_00f1dae9;
    case 5:
      bVar3 = WasmNontrapping::IsEnabled();
      if (!bVar3) {
        this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
        WasmCompilationException::WasmCompilationException
                  (this_01,L"Operator %s is Not Yet Implemented",L"i64.trunc_u:sat/f32");
        goto LAB_00f20380;
      }
switchD_00f1dd8f_caseD_5:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::L_F;
      OVar16 = Conv_Sat_FTUL;
      goto LAB_00f1dae9;
    case 6:
      bVar3 = WasmNontrapping::IsEnabled();
      if (!bVar3) {
        this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
        WasmCompilationException::WasmCompilationException
                  (this_01,L"Operator %s is Not Yet Implemented",L"i64.trunc_s:sat/f64");
        goto LAB_00f20380;
      }
switchD_00f1dd8f_caseD_6:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::L_D;
      OVar16 = Conv_Sat_DTL;
      goto LAB_00f1dae9;
    case 7:
      bVar3 = WasmNontrapping::IsEnabled();
      if (!bVar3) {
        this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
        WasmCompilationException::WasmCompilationException
                  (this_01,L"Operator %s is Not Yet Implemented",L"i64.trunc_u:sat/f64");
        goto LAB_00f20380;
      }
switchD_00f1dd8f_caseD_7:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::L_D;
      OVar16 = Conv_Sat_DTUL;
      goto LAB_00f1dae9;
    }
    switch(op) {
    case wbI32Extend8_s:
      bVar3 = SignExtends::IsEnabled();
      if (!bVar3) {
        this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
        WasmCompilationException::WasmCompilationException
                  (this_01,L"Operator %s is Not Yet Implemented",L"i32.extend8_s");
        goto LAB_00f20380;
      }
switchD_00f1dcd5_caseD_c0:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::I_I;
      OVar16 = I32Extend8_s;
      goto LAB_00f1dae9;
    case wbI32Extend16_s:
      bVar3 = SignExtends::IsEnabled();
      if (!bVar3) {
        this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
        WasmCompilationException::WasmCompilationException
                  (this_01,L"Operator %s is Not Yet Implemented",L"i32.extend16_s");
        goto LAB_00f20380;
      }
switchD_00f1dcd5_caseD_c1:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::I_I;
      OVar16 = I32Extend16_s;
      goto LAB_00f1dae9;
    case wbI64Extend8_s:
      bVar3 = SignExtends::IsEnabled();
      if (!bVar3) {
        this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
        WasmCompilationException::WasmCompilationException
                  (this_01,L"Operator %s is Not Yet Implemented",L"i64.extend8_s");
        goto LAB_00f20380;
      }
switchD_00f1dcd5_caseD_c2:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::L_L;
      OVar16 = I64Extend8_s;
      goto LAB_00f1dae9;
    case wbI64Extend16_s:
      bVar3 = SignExtends::IsEnabled();
      if (!bVar3) {
        this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
        WasmCompilationException::WasmCompilationException
                  (this_01,L"Operator %s is Not Yet Implemented",L"i64.extend16_s");
        goto LAB_00f20380;
      }
switchD_00f1dcd5_caseD_c3:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::L_L;
      OVar16 = I64Extend16_s;
      goto LAB_00f1dae9;
    case wbI64Extend32_s:
      bVar3 = SignExtends::IsEnabled();
      if (!bVar3) {
        this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
        WasmCompilationException::WasmCompilationException
                  (this_01,L"Operator %s is Not Yet Implemented",L"i64.extend32_s");
        goto LAB_00f20380;
      }
switchD_00f1dcd5_caseD_c4:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::L_L;
      OVar16 = I64Extend32_s;
      goto LAB_00f1dae9;
    }
    if (0xefff < op) {
      switch(op) {
      case wbV128Load:
        OVar16 = Simd128_LdArr_F4;
        bVar3 = false;
        goto LAB_00f1ddc0;
      case wbV128Load|wbNop:
      case wbV128Load|wbBlock:
      case wbV128Load|wbLoop:
      case wbV128Load|wbIf:
      case wbV128Load|wbElse:
      case wbV128Load|wbIf|wbBlock:
      case wbV128Load|wbIf|wbLoop:
      case 0xfd08:
      case 0xfd09:
      case 0xfd0a:
      case wbV128Const|wbBlock:
      case wbV128And|wbNop:
      case wbV128Bitselect|wbNop:
      case wbV128Or|wbIf:
      case wbV128Or|wbElse:
      case wbV128Or|wbIf|wbBlock:
      case wbV128Or|wbIf|wbLoop:
      case 0xfd58:
      case 0xfd59:
      case 0xfd5a:
      case wbV128Or|wbEnd:
      case wbV128Or|wbBr:
      case wbV128Or|wbBrIf:
      case wbV128Or|wbBrTable:
      case wbV128Or|wbReturn:
      case wbI4GeU|wbGetLocal:
      case wbI4GeU|wbSetGlobal:
      case wbI4GeU|wbSetGlobal|wbNop:
      case wbI4GeU|wbSetGlobal|wbBlock:
      case wbI4GeU|wbSetGlobal|wbLoop:
      case wbI4GeU|wbI32LoadMem:
      case wbI4GeU|wbI64LoadMem:
      case wbI4GeU|wbF32LoadMem:
      case wbI16AddSaturateU|wbIf:
      case wbI16AddSaturateU|wbElse:
      case wbI16AddSaturateU|wbIf|wbBlock:
      case wbI16AddSaturateU|wbIf|wbLoop:
      case 0xfd78:
      case 0xfd79:
      case 0xfd7a:
      case wbI16AddSaturateU|wbEnd:
      case wbI16AddSaturateU|wbBr:
      case wbI16AddSaturateU|wbBrIf:
      case wbI16AddSaturateU|wbBrTable:
      case wbI16AddSaturateU|wbReturn:
      case wbV128Load|wbI64DivU:
      case wbV128Load|wbI64Or:
      case wbV128Load|wbI64Xor:
      case wbV128Load|wbI64Shl:
      case wbV128Load|wbI64ShrS:
      case wbV128Load|wbI64ShrU:
      case wbV128Load|wbI64Rol:
      case wbV128Load|wbI64Ror:
      case wbI8AddSaturateU|wbIf:
      case wbI8AddSaturateU|wbIf|wbBlock:
      case wbI8AddSaturateU|wbIf|wbLoop:
      case 0xfd98:
      case 0xfd99:
      case 0xfd9a:
      case wbI8AddSaturateU|wbEnd:
      case wbI8AddSaturateU|wbBr:
      case wbI8AddSaturateU|wbBrIf:
      case wbI8AddSaturateU|wbBrTable:
      case wbI8AddSaturateU|wbReturn:
      case wbV128Load|wbF64Add:
      case wbV128Load|wbF64Min:
      case wbV128Load|wbF64Max:
      case wbV128Load|wbF64CopySign:
      case wbV128Load|wbI32Wrap_I64:
      case wbV128Load|wbI32TruncS_F32:
      case wbV128Load|wbI32TruncU_F32:
      case wbV128Load|wbI32TruncS_F64:
      case wbI4Add|wbNop:
      case wbV128Load|wbI64TruncS_F64:
      case wbV128Load|wbF32SConvertI32:
      case wbV128Load|wbF32UConvertI32:
      case wbV128Load|wbF32SConvertI64:
      case wbV128Load|wbF32DemoteF64:
      case wbV128Load|wbF64SConvertI32:
      case wbV128Load|wbF64UConvertI32:
      case wbV128Load|wbF64SConvertI64:
      case wbV128Load|wbF64UConvertI64:
      case wbV128Load|wbF64PromoteF32:
      case wbV128Load|wbI32ReinterpretF32:
      case wbV128Load|wbI64ReinterpretF64:
      case wbV128Load|wbF32ReinterpretI32:
      case wbV128Load|wbF64ReinterpretI64:
      case wbV128Load|wbI32Extend8_s:
      case wbV128Load|wbI64Extend8_s:
      case wbV128Load|wbI64Extend16_s:
      case wbV128Load|wbI64Extend32_s:
      case wbV128Load|wbI64Extend32_s|wbNop:
      case wbV128Load|wbI64Extend32_s|wbBlock:
      case wbV128Load|wbI64Extend32_s|wbLoop:
      case 0xfdc8:
      case 0xfdc9:
      case 0xfdca:
      case wbI2Add|wbNop:
      case wbV128Load|wbI32Extend8_s|wbCall:
      case wbV128Load|wbI32Extend8_s|wbCall|wbBlock:
      case wbV128Load|wbI32Extend8_s|wbCall|wbLoop:
      case wbV128Load|wbI32Extend8_s|wbCall|wbIf:
      case wbV128Load|wbI32Extend8_s|wbCall|wbElse:
      case wbV128Load|wbI32Extend8_s|wbCall|wbIf|wbBlock:
      case wbV128Load|wbI32Extend8_s|wbCall|wbIf|wbLoop:
      case 0xfdd8:
      case 0xfdd9:
      case wbV128Load|wbI32Extend8_s|wbDrop:
      case wbV128Load|wbI32Extend8_s|wbSelect:
      case wbV128Load|wbI32Extend8_s|wbCall|wbBr:
      case wbV128Load|wbI32Extend8_s|wbCall|wbBrIf:
      case wbV128Load|wbI32Extend8_s|wbCall|wbBrTable:
      case wbV128Load|wbI32Extend8_s|wbCall|wbReturn:
      case wbF4Abs|wbBlock:
      case wbF4Min|wbBlock:
      case wbF4Min|wbLoop:
      case wbF2Abs|wbBlock:
      case wbF2Min|wbBlock:
      case wbF2Min|wbLoop:
        goto switchD_00f1dcd5_caseD_6;
      case wbV128Store:
        OVar16 = Simd128_StArr_F4;
        bVar3 = true;
LAB_00f1ddc0:
        info = EmitSimdMemAccess(this,OVar16,(WasmType *)&WasmOpCodeSignatures::V128_I,TYPE_FLOAT32,
                                 '\x10',bVar3);
        goto LAB_00f1dbbb;
      case wbV128Const:
        Simd::EnsureSimdIsEnabled();
        pWVar10 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
        if (pWVar10 == (WasmBinaryReader *)0x0) {
          pWVar10 = (this->m_module->m_reader).ptr;
        }
        WVar15 = (pWVar10->super_WasmReaderBase).m_currentNode.field_1.block;
        puVar12 = (pWVar10->super_WasmReaderBase).m_currentNode.field_1.brTable.targetTable;
        type = V128;
        goto LAB_00f1ef5b;
      case wbV8X16Shuffle:
        Simd::EnsureSimdIsEnabled();
        info = EmitV8X16Shuffle(this);
        goto LAB_00f1dbbb;
      case wbI16Splat:
        pWVar14 = (WasmType *)&WasmOpCodeSignatures::V128_I;
        OVar16 = Simd128_Splat_I16;
        goto LAB_00f1dae9;
      case wbI8Splat:
        pWVar14 = (WasmType *)&WasmOpCodeSignatures::V128_I;
        OVar16 = Simd128_Splat_I8;
        goto LAB_00f1dae9;
      case wbI4Splat:
        pWVar14 = (WasmType *)&WasmOpCodeSignatures::V128_I;
        OVar16 = Simd128_Splat_I4;
        goto LAB_00f1dae9;
      case wbI2Splat:
        pWVar14 = (WasmType *)&WasmOpCodeSignatures::V128_L;
        OVar16 = Simd128_Splat_I2;
        goto LAB_00f1dae9;
      case wbF4Splat:
        pWVar14 = (WasmType *)&WasmOpCodeSignatures::V128_F;
        OVar16 = Simd128_Splat_F4;
        goto LAB_00f1dae9;
      case wbF2Splat:
        pWVar14 = (WasmType *)&WasmOpCodeSignatures::V128_D;
        OVar16 = Simd128_Splat_D2;
        goto LAB_00f1dae9;
      case wbI16ExtractLaneS:
        Simd::EnsureSimdIsEnabled();
        pWVar14 = (WasmType *)&WasmOpCodeSignatures::I_V128;
        OVar16 = Simd128_ExtractLane_I16;
        goto LAB_00f1f1a9;
      case wbI16ExtractLaneU:
        Simd::EnsureSimdIsEnabled();
        pWVar14 = (WasmType *)&WasmOpCodeSignatures::I_V128;
        OVar16 = Simd128_ExtractLane_U16;
        goto LAB_00f1f1a9;
      case wbI16ReplaceLane:
        Simd::EnsureSimdIsEnabled();
        pWVar14 = (WasmType *)&WasmOpCodeSignatures::V128_I;
        OVar16 = Simd128_ReplaceLane_I16;
        goto LAB_00f1f26c;
      case wbI8ExtractLaneS:
        Simd::EnsureSimdIsEnabled();
        pWVar14 = (WasmType *)&WasmOpCodeSignatures::I_V128;
        OVar16 = Simd128_ExtractLane_I8;
        goto LAB_00f1f1a9;
      case wbI8ExtractLaneU:
        Simd::EnsureSimdIsEnabled();
        pWVar14 = (WasmType *)&WasmOpCodeSignatures::I_V128;
        OVar16 = Simd128_ExtractLane_U8;
        goto LAB_00f1f1a9;
      case wbI8ReplaceLane:
        Simd::EnsureSimdIsEnabled();
        pWVar14 = (WasmType *)&WasmOpCodeSignatures::V128_I;
        OVar16 = Simd128_ReplaceLane_I8;
        goto LAB_00f1f26c;
      case wbI4ExtractLane:
        Simd::EnsureSimdIsEnabled();
        pWVar14 = (WasmType *)&WasmOpCodeSignatures::I_V128;
        OVar16 = Simd128_ExtractLane_I4;
        goto LAB_00f1f1a9;
      case wbI4ReplaceLane:
        Simd::EnsureSimdIsEnabled();
        pWVar14 = (WasmType *)&WasmOpCodeSignatures::V128_I;
        OVar16 = Simd128_ReplaceLane_I4;
        goto LAB_00f1f26c;
      case wbI2ExtractLane:
        Simd::EnsureSimdIsEnabled();
        pWVar14 = (WasmType *)&WasmOpCodeSignatures::L_V128;
        OVar16 = Simd128_ExtractLane_I2;
        goto LAB_00f1f1a9;
      case wbI2ReplaceLane:
        Simd::EnsureSimdIsEnabled();
        pWVar14 = (WasmType *)&WasmOpCodeSignatures::V128_L;
        OVar16 = Simd128_ReplaceLane_I2;
        goto LAB_00f1f26c;
      case wbF4ExtractLane:
        Simd::EnsureSimdIsEnabled();
        pWVar14 = (WasmType *)&WasmOpCodeSignatures::F_V128;
        OVar16 = Simd128_ExtractLane_F4;
LAB_00f1f1a9:
        info = EmitExtractLaneExpr(this,OVar16,pWVar14);
        goto LAB_00f1dbbb;
      case wbF4ReplaceLane:
        Simd::EnsureSimdIsEnabled();
        pWVar14 = (WasmType *)&WasmOpCodeSignatures::V128_F;
        OVar16 = Simd128_ReplaceLane_F4;
        goto LAB_00f1f26c;
      case wbF2ExtractLane:
        puVar13 = WasmOpCodeSignatures::D_V128_I;
        OVar16 = Simd128_ExtractLane_D2;
        break;
      case wbF2ReplaceLane:
        Simd::EnsureSimdIsEnabled();
        pWVar14 = (WasmType *)&WasmOpCodeSignatures::V128_D;
        OVar16 = Simd128_ReplaceLane_D2;
LAB_00f1f26c:
        info = EmitReplaceLaneExpr(this,OVar16,pWVar14);
        goto LAB_00f1dbbb;
      case wbI16Eq:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_Eq_I16;
        break;
      case wbI16Ne:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_Neq_I16;
        break;
      case wbI16LtS:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_Lt_I16;
        break;
      case wbI16LtU:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_Lt_U16;
        break;
      case wbI16GtS:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_Gt_I16;
        break;
      case wbI16GtU:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_Gt_U16;
        break;
      case wbI16LeS:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_LtEq_I16;
        break;
      case wbI16LeU:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_LtEq_U16;
        break;
      case wbI16GeS:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_GtEq_I16;
        break;
      case wbI16GeU:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_GtEq_U16;
        break;
      case wbI8Eq:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_Eq_I8;
        break;
      case wbI8Ne:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_Neq_I8;
        break;
      case wbI8LtS:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_Lt_I8;
        break;
      case wbI8LtU:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_Lt_U8;
        break;
      case wbI8GtS:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_Gt_I8;
        break;
      case wbI8GtU:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_Gt_U8;
        break;
      case wbI8LeS:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_LtEq_I8;
        break;
      case wbI8LeU:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_LtEq_U8;
        break;
      case wbI8GeS:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_GtEq_I8;
        break;
      case wbI8GeU:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_GtEq_U8;
        break;
      case wbI4Eq:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_Eq_I4;
        break;
      case wbI4Ne:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_Neq_I4;
        break;
      case wbI4LtS:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_Lt_I4;
        break;
      case wbI4LtU:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_Lt_U4;
        break;
      case wbI4GtS:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_Gt_I4;
        break;
      case wbI4GtU:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_Gt_U4;
        break;
      case wbI4LeS:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_LtEq_I4;
        break;
      case wbI4LeU:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_LtEq_U4;
        break;
      case wbI4GeS:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_GtEq_I4;
        break;
      case wbI4GeU:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_GtEq_U4;
        break;
      case wbF4Eq:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_Eq_F4;
        break;
      case wbF4Ne:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_Neq_F4;
        break;
      case wbF4Lt:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_Lt_F4;
        break;
      case wbF4Gt:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_Gt_F4;
        break;
      case wbF4Le:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_LtEq_F4;
        break;
      case wbF4Ge:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_GtEq_F4;
        break;
      case wbF2Eq:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_Eq_D2;
        break;
      case wbF2Ne:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_Neq_D2;
        break;
      case wbF2Lt:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_Lt_D2;
        break;
      case wbF2Gt:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_Gt_D2;
        break;
      case wbF2Le:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_LtEq_D2;
        break;
      case wbF2Ge:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_GtEq_D2;
        break;
      case wbV128Not:
        pWVar14 = (WasmType *)&WasmOpCodeSignatures::V128_V128;
        OVar16 = Simd128_Not_I4;
        goto LAB_00f1dae9;
      case wbV128And:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_And_I4;
        break;
      case wbV128Or:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_Or_I4;
        break;
      case wbV128Xor:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_Xor_I4;
        break;
      case wbV128Bitselect:
        Simd::EnsureSimdIsEnabled();
        info = EmitV128BitSelect(this);
        goto LAB_00f1dbbb;
      case wbI16Neg:
        pWVar14 = (WasmType *)&WasmOpCodeSignatures::V128_V128;
        OVar16 = Simd128_Neg_I16;
        goto LAB_00f1dae9;
      case wbI16AnyTrue:
        pWVar14 = (WasmType *)&WasmOpCodeSignatures::I_V128;
        OVar16 = Simd128_AnyTrue_B16;
        goto LAB_00f1dae9;
      case wbI16AllTrue:
        pWVar14 = (WasmType *)&WasmOpCodeSignatures::I_V128;
        OVar16 = Simd128_AllTrue_B16;
        goto LAB_00f1dae9;
      case wbI16Shl:
        puVar13 = WasmOpCodeSignatures::V128_V128_I;
        OVar16 = Simd128_ShLtByScalar_I16;
        break;
      case wbI16ShrS:
        puVar13 = WasmOpCodeSignatures::V128_V128_I;
        OVar16 = Simd128_ShRtByScalar_I16;
        break;
      case wbI16ShrU:
        puVar13 = WasmOpCodeSignatures::V128_V128_I;
        OVar16 = Simd128_ShRtByScalar_U16;
        break;
      case wbI16Add:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_Add_I16;
        break;
      case wbI16AddSaturateS:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_AddSaturate_I16;
        break;
      case wbI16AddSaturateU:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_AddSaturate_U16;
        break;
      case wbI16Sub:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_Sub_I16;
        break;
      case wbI16SubSaturateS:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_SubSaturate_I16;
        break;
      case wbI16SubSaturateU:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_SubSaturate_U16;
        break;
      case wbI8Neg:
        pWVar14 = (WasmType *)&WasmOpCodeSignatures::V128_V128;
        OVar16 = Simd128_Neg_I8;
        goto LAB_00f1dae9;
      case wbI8AnyTrue:
        pWVar14 = (WasmType *)&WasmOpCodeSignatures::I_V128;
        OVar16 = Simd128_AnyTrue_B8;
        goto LAB_00f1dae9;
      case wbI8AllTrue:
        pWVar14 = (WasmType *)&WasmOpCodeSignatures::I_V128;
        OVar16 = Simd128_AllTrue_B8;
        goto LAB_00f1dae9;
      case wbI8Shl:
        puVar13 = WasmOpCodeSignatures::V128_V128_I;
        OVar16 = Simd128_ShLtByScalar_I8;
        break;
      case wbI8ShrS:
        puVar13 = WasmOpCodeSignatures::V128_V128_I;
        OVar16 = Simd128_ShRtByScalar_I8;
        break;
      case wbI8ShrU:
        puVar13 = WasmOpCodeSignatures::V128_V128_I;
        OVar16 = Simd128_ShRtByScalar_U8;
        break;
      case wbI8Add:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_Add_I8;
        break;
      case wbI8AddSaturateS:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_AddSaturate_I8;
        break;
      case wbI8AddSaturateU:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_AddSaturate_U8;
        break;
      case wbI8Sub:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_Sub_I8;
        break;
      case wbI8SubSaturateS:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_SubSaturate_I8;
        break;
      case wbI8SubSaturateU:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_SubSaturate_U8;
        break;
      case wbI8Mul:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_Mul_I8;
        break;
      case wbI4Neg:
        pWVar14 = (WasmType *)&WasmOpCodeSignatures::V128_V128;
        OVar16 = Simd128_Neg_I4;
        goto LAB_00f1dae9;
      case wbI4AnyTrue:
        pWVar14 = (WasmType *)&WasmOpCodeSignatures::I_V128;
        OVar16 = Simd128_AnyTrue_B4;
        goto LAB_00f1dae9;
      case wbI4AllTrue:
        pWVar14 = (WasmType *)&WasmOpCodeSignatures::I_V128;
        OVar16 = Simd128_AllTrue_B4;
        goto LAB_00f1dae9;
      case wbI4Shl:
        puVar13 = WasmOpCodeSignatures::V128_V128_I;
        OVar16 = Simd128_ShLtByScalar_I4;
        break;
      case wbI4ShrS:
        puVar13 = WasmOpCodeSignatures::V128_V128_I;
        OVar16 = Simd128_ShRtByScalar_I4;
        break;
      case wbI4ShrU:
        puVar13 = WasmOpCodeSignatures::V128_V128_I;
        OVar16 = Simd128_ShRtByScalar_U4;
        break;
      case wbI4Add:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_Add_I4;
        break;
      case wbI4Sub:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_Sub_I4;
        break;
      case wbI4Mul:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_Mul_I4;
        break;
      case wbI2Neg:
        pWVar14 = (WasmType *)&WasmOpCodeSignatures::V128_V128;
        OVar16 = Simd128_Neg_I2;
        goto LAB_00f1dae9;
      case wbI2Shl:
        puVar13 = WasmOpCodeSignatures::V128_V128_I;
        OVar16 = Simd128_ShLtByScalar_I2;
        break;
      case wbI2ShrS:
        puVar13 = WasmOpCodeSignatures::V128_V128_I;
        OVar16 = Simd128_ShRtByScalar_I2;
        break;
      case wbI2ShrU:
        puVar13 = WasmOpCodeSignatures::V128_V128_I;
        OVar16 = Simd128_ShRtByScalar_U2;
        break;
      case wbI2Add:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_Add_I2;
        break;
      case wbI2Sub:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_Sub_I2;
        break;
      case wbF4Abs:
        pWVar14 = (WasmType *)&WasmOpCodeSignatures::V128_V128;
        OVar16 = Simd128_Abs_F4;
        goto LAB_00f1dae9;
      case wbF4Neg:
        pWVar14 = (WasmType *)&WasmOpCodeSignatures::V128_V128;
        OVar16 = Simd128_Neg_F4;
        goto LAB_00f1dae9;
      case wbF4Sqrt:
        pWVar14 = (WasmType *)&WasmOpCodeSignatures::V128_V128;
        OVar16 = Simd128_Sqrt_F4;
        goto LAB_00f1dae9;
      case wbF4Add:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_Add_F4;
        break;
      case wbF4Sub:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_Sub_F4;
        break;
      case wbF4Mul:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_Mul_F4;
        break;
      case wbF4Div:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_Div_F4;
        break;
      case wbF4Min:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_Min_F4;
        break;
      case wbF4Max:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_Max_F4;
        break;
      case wbF2Abs:
        pWVar14 = (WasmType *)&WasmOpCodeSignatures::V128_V128;
        OVar16 = Simd128_Abs_D2;
        goto LAB_00f1dae9;
      case wbF2Neg:
        pWVar14 = (WasmType *)&WasmOpCodeSignatures::V128_V128;
        OVar16 = Simd128_Neg_D2;
        goto LAB_00f1dae9;
      case wbF2Sqrt:
        pWVar14 = (WasmType *)&WasmOpCodeSignatures::V128_V128;
        OVar16 = Simd128_Sqrt_D2;
        goto LAB_00f1dae9;
      case wbF2Add:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_Add_D2;
        break;
      case wbF2Sub:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_Sub_D2;
        break;
      case wbF2Mul:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_Mul_D2;
        break;
      case wbF2Div:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_Div_D2;
        break;
      case wbF2Min:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_Min_D2;
        break;
      case wbF2Max:
        puVar13 = WasmOpCodeSignatures::V128X3;
        OVar16 = Simd128_Max_D2;
        break;
      case wbI4TruncS:
        pWVar14 = (WasmType *)&WasmOpCodeSignatures::V128_V128;
        OVar16 = Simd128_FromFloat32x4_I4;
        goto LAB_00f1dae9;
      case wbI4TruncU:
        pWVar14 = (WasmType *)&WasmOpCodeSignatures::V128_V128;
        OVar16 = Simd128_FromFloat32x4_U4;
        goto LAB_00f1dae9;
      case wbF4ConvertS:
        pWVar14 = (WasmType *)&WasmOpCodeSignatures::V128_V128;
        OVar16 = Simd128_FromInt32x4_F4;
        goto LAB_00f1dae9;
      case wbF4ConvertU:
        pWVar14 = (WasmType *)&WasmOpCodeSignatures::V128_V128;
        OVar16 = Simd128_FromUint32x4_F4;
        goto LAB_00f1dae9;
      default:
        switch(op) {
        case wbPrintFuncName:
          pWVar14 = (WasmType *)&WasmOpCodeSignatures::V_I;
          OVar16 = PrintFuncName;
          break;
        case wbPrintArgSeparator:
          pIVar19 = this->m_writer;
          pp_Var9 = pIVar19->_vptr_IWasmByteCodeWriter;
          uVar18 = 0x11d;
          goto LAB_00f1e28b;
        case wbPrintBeginCall:
          pIVar19 = this->m_writer;
          pp_Var9 = pIVar19->_vptr_IWasmByteCodeWriter;
          uVar18 = 0x11e;
          goto LAB_00f1e28b;
        case wbPrintNewLine:
          pIVar19 = this->m_writer;
          pp_Var9 = pIVar19->_vptr_IWasmByteCodeWriter;
          uVar18 = 0x11f;
LAB_00f1e28b:
          (*pp_Var9[7])(pIVar19,uVar18);
          uVar6 = 0;
          local_40.field_1.infos = (EmitInfo *)0x0;
          goto LAB_00f1dbc7;
        case wbPrintEndCall:
          pWVar14 = (WasmType *)&WasmOpCodeSignatures::V_I;
          OVar16 = PrintEndCall;
          break;
        case wbPrintEndCall|wbNop:
        case wbPrintEndCall|wbBlock:
        case wbPrintEndCall|wbLoop:
        case 0xf008:
        case 0xf009:
        case 0xf00a:
        case wbPrintFuncName|wbEnd:
          goto switchD_00f1dcd5_caseD_6;
        case wbPrintI32:
          pWVar14 = (WasmType *)&WasmOpCodeSignatures::I_I;
          OVar16 = PrintI32;
          break;
        case wbPrintI64:
          pWVar14 = (WasmType *)&WasmOpCodeSignatures::L_L;
          OVar16 = PrintI64;
          break;
        case wbPrintF32:
          pWVar14 = (WasmType *)&WasmOpCodeSignatures::F_F;
          OVar16 = PrintF32;
          break;
        case wbPrintF64:
          pWVar14 = (WasmType *)&WasmOpCodeSignatures::D_D;
          OVar16 = PrintF64;
          break;
        default:
          switch(op - 0xfc00) {
          case 0:
            goto switchD_00f1dd8f_caseD_0;
          case 1:
            goto switchD_00f1dd8f_caseD_1;
          case 2:
            goto switchD_00f1dd8f_caseD_2;
          case 3:
            goto switchD_00f1dd8f_caseD_3;
          case 4:
            goto switchD_00f1dd8f_caseD_4;
          case 5:
            goto switchD_00f1dd8f_caseD_5;
          case 6:
            goto switchD_00f1dd8f_caseD_6;
          case 7:
            goto switchD_00f1dd8f_caseD_7;
          }
          goto switchD_00f1dcd5_caseD_6;
        }
        goto LAB_00f1dae9;
      }
      goto LAB_00f1f6b5;
    }
    switch((ulong)op) {
    case 0:
      (*this->m_writer->_vptr_IWasmByteCodeWriter[7])(this->m_writer,0x10b);
      SetUnreachableState(this,true);
      goto LAB_00f1df69;
    case 1:
      goto switchD_00f1dcd5_caseD_1;
    case 2:
      PVar20 = EmitBlock(this);
      goto LAB_00f1f709;
    case 3:
      PVar20 = EmitLoop(this);
      goto LAB_00f1f709;
    case 4:
      PVar20 = EmitIfElseExpr(this);
      goto LAB_00f1f709;
    case 5:
      this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
      WasmCompilationException::WasmCompilationException(this_01,L"Unexpected else opcode");
      goto LAB_00f20380;
    default:
      goto switchD_00f1dcd5_caseD_6;
    case 0xb:
      this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
      WasmCompilationException::WasmCompilationException(this_01,L"Unexpected end opcode");
      goto LAB_00f20380;
    case 0xc:
      EmitBr(this);
      goto LAB_00f1df69;
    case 0xd:
      PVar20 = EmitBrIf(this);
      goto LAB_00f1f709;
    case 0xe:
      EmitBrTable(this);
      goto LAB_00f1df69;
    case 0xf:
      EmitReturnExpr(this,(PolymorphicEmitInfo *)0x0);
LAB_00f1df69:
      info.super_EmitInfoBase.location = 0xffffffff;
      info.type = Any;
      goto LAB_00f1dbbb;
    case 0x10:
      PVar20 = EmitCall<(Wasm::WasmOp)16>(this);
      goto LAB_00f1f709;
    case 0x11:
      PVar20 = EmitCall<(Wasm::WasmOp)17>(this);
LAB_00f1f709:
      local_40.field_1 = PVar20.field_1;
      uVar6 = PVar20.count;
      goto LAB_00f1dbc7;
    case 0x1a:
      info = EmitDrop(this);
      goto LAB_00f1dbbb;
    case 0x1b:
      info = EmitSelect(this);
      goto LAB_00f1dbbb;
    case 0x20:
      info = EmitGetLocal(this);
      goto LAB_00f1dbbb;
    case 0x21:
      bVar3 = false;
      goto LAB_00f1e013;
    case 0x22:
      bVar3 = true;
LAB_00f1e013:
      info = EmitSetLocal(this,bVar3);
      goto LAB_00f1dbbb;
    case 0x23:
      info = EmitGetGlobal(this);
      goto LAB_00f1dbbb;
    case 0x24:
      info = EmitSetGlobal(this);
      goto LAB_00f1dbbb;
    case 0x28:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::I_I;
      WVar17 = wbI32LoadMem;
      VVar11 = TYPE_INT32;
      goto LAB_00f1f5f8;
    case 0x29:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::L_I;
      WVar17 = wbI64LoadMem;
      VVar11 = TYPE_INT64;
      goto LAB_00f1f5f8;
    case 0x2a:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::F_I;
      WVar17 = wbF32LoadMem;
      VVar11 = TYPE_FLOAT32;
      goto LAB_00f1f5f8;
    case 0x2b:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::D_I;
      WVar17 = wbF64LoadMem;
      VVar11 = TYPE_FLOAT64;
      goto LAB_00f1f5f8;
    case 0x2c:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::I_I;
      WVar17 = wbI32LoadMem8S;
      VVar11 = TYPE_INT8;
      goto LAB_00f1f5f8;
    case 0x2d:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::I_I;
      WVar17 = wbI32LoadMem8U;
      VVar11 = TYPE_UINT8;
      goto LAB_00f1f5f8;
    case 0x2e:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::I_I;
      WVar17 = wbI32LoadMem16S;
      VVar11 = TYPE_INT16;
      goto LAB_00f1f5f8;
    case 0x2f:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::I_I;
      WVar17 = wbI32LoadMem16U;
      VVar11 = TYPE_UINT16;
      goto LAB_00f1f5f8;
    case 0x30:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::L_I;
      WVar17 = wbI64LoadMem8S;
      VVar11 = TYPE_INT8_TO_INT64;
      goto LAB_00f1f5f8;
    case 0x31:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::L_I;
      WVar17 = wbI64LoadMem8U;
      VVar11 = TYPE_UINT8_TO_INT64;
      goto LAB_00f1f5f8;
    case 0x32:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::L_I;
      WVar17 = wbI64LoadMem16S;
      VVar11 = TYPE_INT16_TO_INT64;
      goto LAB_00f1f5f8;
    case 0x33:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::L_I;
      WVar17 = wbI64LoadMem16U;
      VVar11 = TYPE_UINT16_TO_INT64;
      goto LAB_00f1f5f8;
    case 0x34:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::L_I;
      WVar17 = wbI64LoadMem32S;
      VVar11 = TYPE_INT32_TO_INT64;
      goto LAB_00f1f5f8;
    case 0x35:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::L_I;
      WVar17 = wbI64LoadMem32U;
      VVar11 = TYPE_UINT32_TO_INT64;
LAB_00f1f5f8:
      info = EmitMemAccess<false,false>(this,WVar17,pWVar14,VVar11);
      goto LAB_00f1dbbb;
    case 0x36:
      puVar13 = WasmOpCodeSignatures::I_II;
      WVar17 = wbI32StoreMem;
      VVar11 = TYPE_INT32;
      goto LAB_00f1f6d3;
    case 0x37:
      puVar13 = WasmOpCodeSignatures::L_IL;
      WVar17 = wbI64StoreMem;
      VVar11 = TYPE_INT64;
      goto LAB_00f1f6d3;
    case 0x38:
      puVar13 = WasmOpCodeSignatures::F_IF;
      WVar17 = wbF32StoreMem;
      VVar11 = TYPE_FLOAT32;
      goto LAB_00f1f6d3;
    case 0x39:
      puVar13 = WasmOpCodeSignatures::D_ID;
      WVar17 = wbF64StoreMem;
      VVar11 = TYPE_FLOAT64;
      goto LAB_00f1f6d3;
    case 0x3a:
      puVar13 = WasmOpCodeSignatures::I_II;
      WVar17 = wbI32StoreMem8;
      VVar11 = TYPE_INT8;
      goto LAB_00f1f6d3;
    case 0x3b:
      puVar13 = WasmOpCodeSignatures::I_II;
      WVar17 = wbI32StoreMem16;
      VVar11 = TYPE_INT16;
      goto LAB_00f1f6d3;
    case 0x3c:
      puVar13 = WasmOpCodeSignatures::L_IL;
      WVar17 = wbI64StoreMem8;
      VVar11 = TYPE_INT8_TO_INT64;
      goto LAB_00f1f6d3;
    case 0x3d:
      puVar13 = WasmOpCodeSignatures::L_IL;
      WVar17 = wbI64StoreMem16;
      VVar11 = TYPE_INT16_TO_INT64;
      goto LAB_00f1f6d3;
    case 0x3e:
      puVar13 = WasmOpCodeSignatures::L_IL;
      WVar17 = wbI64StoreMem32;
      VVar11 = TYPE_INT32_TO_INT64;
LAB_00f1f6d3:
      info = EmitMemAccess<true,false>(this,WVar17,(WasmType *)puVar13,VVar11);
      goto LAB_00f1dbbb;
    case 0x3f:
      SetUsesMemory(this,0);
      this_00 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                          (&this->mTypedRegisterAllocator,INT32);
      RVar5 = WAsmJs::RegisterSpace::AcquireTmpRegister(this_00);
      local_40.count = 0;
      PolymorphicEmitInfo::Init(&local_40,(EmitInfo)((ulong)RVar5 | 0x100000000));
      uVar6 = local_40.count;
      (*this->m_writer->_vptr_IWasmByteCodeWriter[0xe])(this->m_writer,0x109,(ulong)RVar5);
      goto LAB_00f1dbc7;
    case 0x40:
      info = EmitGrowMemory(this);
      goto LAB_00f1dbbb;
    case 0x41:
      pWVar10 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
      if (pWVar10 == (WasmBinaryReader *)0x0) {
        pWVar10 = (this->m_module->m_reader).ptr;
      }
      WVar15 = (pWVar10->super_WasmReaderBase).m_currentNode.field_1.block;
      puVar12 = (pWVar10->super_WasmReaderBase).m_currentNode.field_1.brTable.targetTable;
      type = FirstLocalType;
      goto LAB_00f1ef5b;
    case 0x42:
      pWVar10 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
      if (pWVar10 == (WasmBinaryReader *)0x0) {
        pWVar10 = (this->m_module->m_reader).ptr;
      }
      WVar15 = (pWVar10->super_WasmReaderBase).m_currentNode.field_1.block;
      puVar12 = (pWVar10->super_WasmReaderBase).m_currentNode.field_1.brTable.targetTable;
      type = I64;
      goto LAB_00f1ef5b;
    case 0x43:
      pWVar10 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
      if (pWVar10 == (WasmBinaryReader *)0x0) {
        pWVar10 = (this->m_module->m_reader).ptr;
      }
      WVar15 = (pWVar10->super_WasmReaderBase).m_currentNode.field_1.block;
      puVar12 = (pWVar10->super_WasmReaderBase).m_currentNode.field_1.brTable.targetTable;
      type = F32;
      goto LAB_00f1ef5b;
    case 0x44:
      pWVar10 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
      if (pWVar10 == (WasmBinaryReader *)0x0) {
        pWVar10 = (this->m_module->m_reader).ptr;
      }
      WVar15 = (pWVar10->super_WasmReaderBase).m_currentNode.field_1.block;
      puVar12 = (pWVar10->super_WasmReaderBase).m_currentNode.field_1.brTable.targetTable;
      type = F64;
LAB_00f1ef5b:
      cnst.field_0._8_8_ = puVar12;
      cnst.field_0.f64 = (double)WVar15;
      info = EmitConst(this,type,cnst);
      goto LAB_00f1dbbb;
    case 0x45:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::I_I;
      OVar16 = Eqz_Int;
      goto LAB_00f1dae9;
    case 0x46:
      puVar13 = WasmOpCodeSignatures::I_II;
      OVar16 = CmEq_Int;
      break;
    case 0x47:
      puVar13 = WasmOpCodeSignatures::I_II;
      OVar16 = CmNe_Int;
      break;
    case 0x48:
      puVar13 = WasmOpCodeSignatures::I_II;
      OVar16 = CmLt_Int;
      break;
    case 0x49:
      puVar13 = WasmOpCodeSignatures::I_II;
      OVar16 = CmLt_UInt;
      break;
    case 0x4a:
      puVar13 = WasmOpCodeSignatures::I_II;
      OVar16 = CmGt_Int;
      break;
    case 0x4b:
      puVar13 = WasmOpCodeSignatures::I_II;
      OVar16 = CmGt_UInt;
      break;
    case 0x4c:
      puVar13 = WasmOpCodeSignatures::I_II;
      OVar16 = CmLe_Int;
      break;
    case 0x4d:
      puVar13 = WasmOpCodeSignatures::I_II;
      OVar16 = CmLe_UInt;
      break;
    case 0x4e:
      puVar13 = WasmOpCodeSignatures::I_II;
      OVar16 = CmGe_Int;
      break;
    case 0x4f:
      puVar13 = WasmOpCodeSignatures::I_II;
      OVar16 = CmGe_UInt;
      break;
    case 0x50:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::I_L;
      OVar16 = Eqz_Long;
      goto LAB_00f1dae9;
    case 0x51:
      puVar13 = WasmOpCodeSignatures::I_LL;
      OVar16 = CmEq_Long;
      break;
    case 0x52:
      puVar13 = WasmOpCodeSignatures::I_LL;
      OVar16 = CmNe_Long;
      break;
    case 0x53:
      puVar13 = WasmOpCodeSignatures::I_LL;
      OVar16 = CmLt_Long;
      break;
    case 0x54:
      puVar13 = WasmOpCodeSignatures::I_LL;
      OVar16 = CmLt_ULong;
      break;
    case 0x55:
      puVar13 = WasmOpCodeSignatures::I_LL;
      OVar16 = CmGt_Long;
      break;
    case 0x56:
      puVar13 = WasmOpCodeSignatures::I_LL;
      OVar16 = CmGt_ULong;
      break;
    case 0x57:
      puVar13 = WasmOpCodeSignatures::I_LL;
      OVar16 = CmLe_Long;
      break;
    case 0x58:
      puVar13 = WasmOpCodeSignatures::I_LL;
      OVar16 = CmLe_ULong;
      break;
    case 0x59:
      puVar13 = WasmOpCodeSignatures::I_LL;
      OVar16 = CmGe_Long;
      break;
    case 0x5a:
      puVar13 = WasmOpCodeSignatures::I_LL;
      OVar16 = CmGe_ULong;
      break;
    case 0x5b:
      puVar13 = WasmOpCodeSignatures::I_FF;
      OVar16 = CmEq_Flt;
      break;
    case 0x5c:
      puVar13 = WasmOpCodeSignatures::I_FF;
      OVar16 = CmNe_Flt;
      break;
    case 0x5d:
      puVar13 = WasmOpCodeSignatures::I_FF;
      OVar16 = CmLt_Flt;
      break;
    case 0x5e:
      puVar13 = WasmOpCodeSignatures::I_FF;
      OVar16 = CmGt_Flt;
      break;
    case 0x5f:
      puVar13 = WasmOpCodeSignatures::I_FF;
      OVar16 = CmLe_Flt;
      break;
    case 0x60:
      puVar13 = WasmOpCodeSignatures::I_FF;
      OVar16 = CmGe_Flt;
      break;
    case 0x61:
      puVar13 = WasmOpCodeSignatures::I_DD;
      OVar16 = CmEq_Db;
      break;
    case 0x62:
      puVar13 = WasmOpCodeSignatures::I_DD;
      OVar16 = CmNe_Db;
      break;
    case 99:
      puVar13 = WasmOpCodeSignatures::I_DD;
      OVar16 = CmLt_Db;
      break;
    case 100:
      puVar13 = WasmOpCodeSignatures::I_DD;
      OVar16 = CmGt_Db;
      break;
    case 0x65:
      puVar13 = WasmOpCodeSignatures::I_DD;
      OVar16 = CmLe_Db;
      break;
    case 0x66:
      puVar13 = WasmOpCodeSignatures::I_DD;
      OVar16 = CmGe_Db;
      break;
    case 0x67:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::I_I;
      OVar16 = Clz32_Int;
      goto LAB_00f1dae9;
    case 0x68:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::I_I;
      OVar16 = Ctz_Int;
      goto LAB_00f1dae9;
    case 0x69:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::I_I;
      OVar16 = PopCnt_Int;
      goto LAB_00f1dae9;
    case 0x6a:
      puVar13 = WasmOpCodeSignatures::I_II;
      OVar16 = Add_Int;
      break;
    case 0x6b:
      puVar13 = WasmOpCodeSignatures::I_II;
      OVar16 = Sub_Int;
      break;
    case 0x6c:
      puVar13 = WasmOpCodeSignatures::I_II;
      OVar16 = Mul_Int;
      break;
    case 0x6d:
      puVar13 = WasmOpCodeSignatures::I_II;
      OVar16 = Div_Trap_Int;
      break;
    case 0x6e:
      puVar13 = WasmOpCodeSignatures::I_II;
      OVar16 = Div_Trap_UInt;
      break;
    case 0x6f:
      puVar13 = WasmOpCodeSignatures::I_II;
      OVar16 = Rem_Trap_Int;
      break;
    case 0x70:
      puVar13 = WasmOpCodeSignatures::I_II;
      OVar16 = Rem_Trap_UInt;
      break;
    case 0x71:
      puVar13 = WasmOpCodeSignatures::I_II;
      OVar16 = And_Int;
      break;
    case 0x72:
      puVar13 = WasmOpCodeSignatures::I_II;
      OVar16 = Or_Int;
      break;
    case 0x73:
      puVar13 = WasmOpCodeSignatures::I_II;
      OVar16 = Xor_Int;
      break;
    case 0x74:
      puVar13 = WasmOpCodeSignatures::I_II;
      OVar16 = Shl_Int;
      break;
    case 0x75:
      puVar13 = WasmOpCodeSignatures::I_II;
      OVar16 = Shr_Int;
      break;
    case 0x76:
      puVar13 = WasmOpCodeSignatures::I_II;
      OVar16 = Shr_UInt;
      break;
    case 0x77:
      puVar13 = WasmOpCodeSignatures::I_II;
      OVar16 = Rol_Int;
      break;
    case 0x78:
      puVar13 = WasmOpCodeSignatures::I_II;
      OVar16 = Ror_Int;
      break;
    case 0x79:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::L_L;
      OVar16 = Clz_Long;
      goto LAB_00f1dae9;
    case 0x7a:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::L_L;
      OVar16 = Ctz_Long;
      goto LAB_00f1dae9;
    case 0x7b:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::L_L;
      OVar16 = PopCnt_Long;
      goto LAB_00f1dae9;
    case 0x7c:
      puVar13 = WasmOpCodeSignatures::L_LL;
      OVar16 = Add_Long;
      break;
    case 0x7d:
      puVar13 = WasmOpCodeSignatures::L_LL;
      OVar16 = Sub_Long;
      break;
    case 0x7e:
      puVar13 = WasmOpCodeSignatures::L_LL;
      OVar16 = Mul_Long;
      break;
    case 0x7f:
      puVar13 = WasmOpCodeSignatures::L_LL;
      OVar16 = Div_Trap_Long;
      break;
    case 0x80:
      puVar13 = WasmOpCodeSignatures::L_LL;
      OVar16 = Div_Trap_ULong;
      break;
    case 0x81:
      puVar13 = WasmOpCodeSignatures::L_LL;
      OVar16 = Rem_Trap_Long;
      break;
    case 0x82:
      puVar13 = WasmOpCodeSignatures::L_LL;
      OVar16 = Rem_Trap_ULong;
      break;
    case 0x83:
      puVar13 = WasmOpCodeSignatures::L_LL;
      OVar16 = And_Long;
      break;
    case 0x84:
      puVar13 = WasmOpCodeSignatures::L_LL;
      OVar16 = Or_Long;
      break;
    case 0x85:
      puVar13 = WasmOpCodeSignatures::L_LL;
      OVar16 = Xor_Long;
      break;
    case 0x86:
      puVar13 = WasmOpCodeSignatures::L_LL;
      OVar16 = Shl_Long;
      break;
    case 0x87:
      puVar13 = WasmOpCodeSignatures::L_LL;
      OVar16 = Shr_Long;
      break;
    case 0x88:
      puVar13 = WasmOpCodeSignatures::L_LL;
      OVar16 = Shr_ULong;
      break;
    case 0x89:
      puVar13 = WasmOpCodeSignatures::L_LL;
      OVar16 = Rol_Long;
      break;
    case 0x8a:
      puVar13 = WasmOpCodeSignatures::L_LL;
      OVar16 = Ror_Long;
      break;
    case 0x8b:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::F_F;
      OVar16 = Abs_Flt;
      goto LAB_00f1dae9;
    case 0x8c:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::F_F;
      OVar16 = Neg_Flt;
      goto LAB_00f1dae9;
    case 0x8d:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::F_F;
      OVar16 = Ceil_Flt;
      goto LAB_00f1dae9;
    case 0x8e:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::F_F;
      OVar16 = Floor_Flt;
      goto LAB_00f1dae9;
    case 0x8f:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::F_F;
      OVar16 = Trunc_Flt;
      goto LAB_00f1dae9;
    case 0x90:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::F_F;
      OVar16 = Nearest_Flt;
      goto LAB_00f1dae9;
    case 0x91:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::F_F;
      OVar16 = Sqrt_Flt;
      goto LAB_00f1dae9;
    case 0x92:
      puVar13 = WasmOpCodeSignatures::F_FF;
      OVar16 = Add_Flt;
      break;
    case 0x93:
      puVar13 = WasmOpCodeSignatures::F_FF;
      OVar16 = Sub_Flt;
      break;
    case 0x94:
      puVar13 = WasmOpCodeSignatures::F_FF;
      OVar16 = Mul_Flt;
      break;
    case 0x95:
      puVar13 = WasmOpCodeSignatures::F_FF;
      OVar16 = Div_Flt;
      break;
    case 0x96:
      puVar13 = WasmOpCodeSignatures::F_FF;
      OVar16 = Min_Flt;
      break;
    case 0x97:
      puVar13 = WasmOpCodeSignatures::F_FF;
      OVar16 = Max_Flt;
      break;
    case 0x98:
      puVar13 = WasmOpCodeSignatures::F_FF;
      OVar16 = Copysign_Flt;
      break;
    case 0x99:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::D_D;
      OVar16 = Abs_Db;
      goto LAB_00f1dae9;
    case 0x9a:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::D_D;
      OVar16 = Neg_Db;
      goto LAB_00f1dae9;
    case 0x9b:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::D_D;
      OVar16 = Ceil_Db;
      goto LAB_00f1dae9;
    case 0x9c:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::D_D;
      OVar16 = Floor_Db;
      goto LAB_00f1dae9;
    case 0x9d:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::D_D;
      OVar16 = Trunc_Db;
      goto LAB_00f1dae9;
    case 0x9e:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::D_D;
      OVar16 = Nearest_Db;
      goto LAB_00f1dae9;
    case 0x9f:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::D_D;
      OVar16 = Sqrt_Db;
      goto LAB_00f1dae9;
    case 0xa0:
      puVar13 = WasmOpCodeSignatures::D_DD;
      OVar16 = Add_Db;
      break;
    case 0xa1:
      puVar13 = WasmOpCodeSignatures::D_DD;
      OVar16 = Sub_Db;
      break;
    case 0xa2:
      puVar13 = WasmOpCodeSignatures::D_DD;
      OVar16 = Mul_Db;
      break;
    case 0xa3:
      puVar13 = WasmOpCodeSignatures::D_DD;
      OVar16 = Div_Db;
      break;
    case 0xa4:
      puVar13 = WasmOpCodeSignatures::D_DD;
      OVar16 = Min_Db;
      break;
    case 0xa5:
      puVar13 = WasmOpCodeSignatures::D_DD;
      OVar16 = Max_Db;
      break;
    case 0xa6:
      puVar13 = WasmOpCodeSignatures::D_DD;
      OVar16 = Copysign_Db;
      break;
    case 0xa7:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::I_L;
      OVar16 = Conv_LTI;
      goto LAB_00f1dae9;
    case 0xa8:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::I_F;
      OVar16 = Conv_Check_FTI;
      goto LAB_00f1dae9;
    case 0xa9:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::I_F;
      OVar16 = Conv_Check_FTU;
      goto LAB_00f1dae9;
    case 0xaa:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::I_D;
      OVar16 = Conv_Check_DTI;
      goto LAB_00f1dae9;
    case 0xab:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::I_D;
      OVar16 = Conv_Check_DTU;
      goto LAB_00f1dae9;
    case 0xac:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::L_I;
      OVar16 = Conv_ITL;
      goto LAB_00f1dae9;
    case 0xad:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::L_I;
      OVar16 = Conv_UTL;
      goto LAB_00f1dae9;
    case 0xae:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::L_F;
      OVar16 = Conv_Check_FTL;
      goto LAB_00f1dae9;
    case 0xaf:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::L_F;
      OVar16 = Conv_Check_FTUL;
      goto LAB_00f1dae9;
    case 0xb0:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::L_D;
      OVar16 = Conv_Check_DTL;
      goto LAB_00f1dae9;
    case 0xb1:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::L_D;
      OVar16 = Conv_Check_DTUL;
      goto LAB_00f1dae9;
    case 0xb2:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::F_I;
      OVar16 = Fround_Int;
      goto LAB_00f1dae9;
    case 0xb3:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::F_I;
      OVar16 = Conv_UTF;
      goto LAB_00f1dae9;
    case 0xb4:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::F_L;
      OVar16 = Conv_LTF;
      goto LAB_00f1dae9;
    case 0xb5:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::F_L;
      OVar16 = Conv_ULTF;
      goto LAB_00f1dae9;
    case 0xb6:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::F_D;
      OVar16 = Fround_Db;
      goto LAB_00f1dae9;
    case 0xb7:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::D_I;
      OVar16 = Conv_ITD;
      goto LAB_00f1dae9;
    case 0xb8:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::D_I;
      OVar16 = Conv_UTD;
      goto LAB_00f1dae9;
    case 0xb9:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::D_L;
      OVar16 = Conv_LTD;
      goto LAB_00f1dae9;
    case 0xba:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::D_L;
      OVar16 = Conv_ULTD;
      goto LAB_00f1dae9;
    case 0xbb:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::D_F;
      OVar16 = Conv_FTD;
      goto LAB_00f1dae9;
    case 0xbc:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::I_F;
      OVar16 = Reinterpret_FTI;
      goto LAB_00f1dae9;
    case 0xbd:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::L_D;
      OVar16 = Reinterpret_DTL;
      goto LAB_00f1dae9;
    case 0xbe:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::F_I;
      OVar16 = Reinterpret_ITF;
      goto LAB_00f1dae9;
    case 0xbf:
      pWVar14 = (WasmType *)&WasmOpCodeSignatures::D_L;
      OVar16 = Reinterpret_LTD;
LAB_00f1dae9:
      info = EmitUnaryExpr(this,OVar16,pWVar14);
      goto LAB_00f1dbbb;
    case 0xc0:
      goto switchD_00f1dcd5_caseD_c0;
    case 0xc1:
      goto switchD_00f1dcd5_caseD_c1;
    case 0xc2:
      goto switchD_00f1dcd5_caseD_c2;
    case 0xc3:
      goto switchD_00f1dcd5_caseD_c3;
    case 0xc4:
      goto switchD_00f1dcd5_caseD_c4;
    }
LAB_00f1f6b5:
    info = EmitBinExpr(this,OVar16,(WasmType *)puVar13);
LAB_00f1dbbb:
    local_40.count = 0;
    PolymorphicEmitInfo::Init(&local_40,info);
    uVar6 = local_40.count;
LAB_00f1dbc7:
    PVar20._4_4_ = 0;
    PVar20.count = uVar6;
    PVar20.field_1.singleInfo = local_40.field_1.singleInfo;
    PushEvalStack(this,PVar20);
    pFVar1 = (this->m_funcInfo->m_body).ptr;
    if (pFVar1 == (FunctionBody *)0x0) {
      bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,WasmBytecodePhase);
    }
    else {
      uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar1);
      pFVar1 = (this->m_funcInfo->m_body).ptr;
      pFVar8 = (pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      if (pFVar8 == (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/../Runtime/Base/FunctionBody.h"
                           ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar3) {
LAB_00f1f714:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar7 = 0;
        pFVar8 = (pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      }
      bVar3 = Js::Phases::IsEnabled
                        ((Phases *)&DAT_015b6718,WasmBytecodePhase,uVar4,pFVar8->functionId);
    }
    if (bVar3 != false) {
      PrintOpEnd(this);
      return;
    }
switchD_00f1dcd5_caseD_1:
    return;
  }
LAB_00f20380:
  __cxa_throw(this_01,&WasmCompilationException::typeinfo,
              WasmCompilationException::~WasmCompilationException);
switchD_00f1dcd5_caseD_6:
  this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
  WasmCompilationException::WasmCompilationException
            (this_01,L"Unknown expression\'s op 0x%X",(ulong)op);
  goto LAB_00f20380;
}

Assistant:

void WasmBytecodeGenerator::EmitExpr(WasmOp op)
{
    DebugPrintOp(op);
    switch (op)
    {
#define WASM_OPCODE(opname, opcode, sig, imp, wat) \
    case opcode: \
        if (!imp) throw WasmCompilationException(_u("Operator %s is Not Yet Implemented"), _u(wat)); break;
#include "WasmBinaryOpCodes.h"
    default:
        break;
    }

    PolymorphicEmitInfo info;
    switch (op)
    {
    case wbGetGlobal:
        info = EmitGetGlobal();
        break;
    case wbSetGlobal:
        info = EmitSetGlobal();
        break;
    case wbGetLocal:
        info = EmitGetLocal();
        break;
    case wbSetLocal:
        info = EmitSetLocal(false);
        break;
    case wbTeeLocal:
        info = EmitSetLocal(true);
        break;
    case wbReturn:
        EmitReturnExpr();
        info = EmitInfo(WasmTypes::Any);
        break;
    case wbF32Const:
        info = EmitConst(WasmTypes::F32, GetReader()->m_currentNode.cnst);
        break;
    case wbF64Const:
        info = EmitConst(WasmTypes::F64, GetReader()->m_currentNode.cnst);
        break;
    case wbI32Const:
        info = EmitConst(WasmTypes::I32, GetReader()->m_currentNode.cnst);
        break;
    case wbI64Const:
        info = EmitConst(WasmTypes::I64, GetReader()->m_currentNode.cnst);
        break;
#ifdef ENABLE_WASM_SIMD
    case wbV128Const:
        Simd::EnsureSimdIsEnabled();
        info = EmitConst(WasmTypes::V128, GetReader()->m_currentNode.cnst);
        break;
#endif
    case wbBlock:
        info = EmitBlock();
        break;
    case wbLoop:
        info = EmitLoop();
        break;
    case wbCall:
        info = EmitCall<wbCall>();
        break;
    case wbCallIndirect:
        info = EmitCall<wbCallIndirect>();
        break;
    case wbIf:
        info = EmitIfElseExpr();
        break;
    case wbElse:
        throw WasmCompilationException(_u("Unexpected else opcode"));
    case wbEnd:
        throw WasmCompilationException(_u("Unexpected end opcode"));
    case wbBr:
        EmitBr();
        info = EmitInfo(WasmTypes::Any);
        break;
    case wbBrIf:
        info = EmitBrIf();
        break;
    case wbSelect:
        info = EmitSelect();
        break;
    case wbBrTable:
        EmitBrTable();
        info = EmitInfo(WasmTypes::Any);
        break;
    case wbDrop:
        info = EmitDrop();
        break;
    case wbNop:
        return;
    case wbMemorySize:
    {
        SetUsesMemory(0);
        Js::RegSlot tempReg = GetRegisterSpace(WasmTypes::I32)->AcquireTmpRegister();
        info = EmitInfo(tempReg, WasmTypes::I32);
        m_writer->AsmReg1(Js::OpCodeAsmJs::MemorySize_Int, tempReg);
        break;
    }
    case wbMemoryGrow:
    {
        info = EmitGrowMemory();
        break;
    }
    case wbUnreachable:
        m_writer->EmptyAsm(Js::OpCodeAsmJs::Unreachable_Void);
        SetUnreachableState(true);
        info = EmitInfo(WasmTypes::Any);
        break;
#ifdef ENABLE_WASM_SIMD
    case wbV128Bitselect:
        Simd::EnsureSimdIsEnabled();
        info = EmitV128BitSelect();
        break;
    case wbV8X16Shuffle:
        Simd::EnsureSimdIsEnabled();
        info = EmitV8X16Shuffle();
        break;
#define WASM_EXTRACTLANE_OPCODE(opname, opcode, sig, asmjsop, ...) \
    case wb##opname: \
        Simd::EnsureSimdIsEnabled();\
        info = EmitExtractLaneExpr(Js::OpCodeAsmJs::##asmjsop, WasmOpCodeSignatures::sig); \
        break;
#define WASM_REPLACELANE_OPCODE(opname, opcode, sig, asmjsop, ...) \
    case wb##opname: \
        Simd::EnsureSimdIsEnabled();\
        info = EmitReplaceLaneExpr(Js::OpCodeAsmJs::##asmjsop, WasmOpCodeSignatures::sig); \
        break;
#endif
#define WASM_MEMREAD_OPCODE(opname, opcode, sig, imp, viewtype, wat) \
    case wb##opname: \
        Assert(WasmOpCodeSignatures::n##sig > 0);\
        info = EmitMemAccess<false, false>(wb##opname, WasmOpCodeSignatures::sig, viewtype); \
        break;
#define WASM_ATOMICREAD_OPCODE(opname, opcode, sig, imp, viewtype, wat) \
    case wb##opname: \
        Assert(WasmOpCodeSignatures::n##sig > 0);\
        info = EmitMemAccess<false, true>(wb##opname, WasmOpCodeSignatures::sig, viewtype); \
        break;
#define WASM_MEMSTORE_OPCODE(opname, opcode, sig, imp, viewtype, wat) \
    case wb##opname: \
        Assert(WasmOpCodeSignatures::n##sig > 0);\
        info = EmitMemAccess<true, false>(wb##opname, WasmOpCodeSignatures::sig, viewtype); \
        break;
#define WASM_ATOMICSTORE_OPCODE(opname, opcode, sig, imp, viewtype, wat) \
    case wb##opname: \
        Assert(WasmOpCodeSignatures::n##sig > 0);\
        info = EmitMemAccess<true, true>(wb##opname, WasmOpCodeSignatures::sig, viewtype); \
        break;
#define WASM_SIMD_MEMREAD_OPCODE(opname, opcode, sig, asmjsop, viewtype, dataWidth, ...) \
    case wb##opname: \
        Assert(WasmOpCodeSignatures::n##sig > 0);\
        info = EmitSimdMemAccess(Js::OpCodeAsmJs::##asmjsop, WasmOpCodeSignatures::sig, viewtype, dataWidth, false); \
        break;
#define WASM_SIMD_MEMSTORE_OPCODE(opname, opcode, sig, asmjsop, viewtype, dataWidth, ...) \
    case wb##opname: \
        Assert(WasmOpCodeSignatures::n##sig > 0);\
        info = EmitSimdMemAccess(Js::OpCodeAsmJs::##asmjsop, WasmOpCodeSignatures::sig, viewtype, dataWidth, true); \
        break;
#define WASM_BINARY_OPCODE(opname, opcode, sig, asmjsop, imp, wat) \
    case wb##opname: \
        Assert(WasmOpCodeSignatures::n##sig == 3);\
        info = EmitBinExpr(Js::OpCodeAsmJs::##asmjsop, WasmOpCodeSignatures::sig); \
        break;
#define WASM_UNARY__OPCODE(opname, opcode, sig, asmjsop, imp, wat) \
    case wb##opname: \
        Assert(WasmOpCodeSignatures::n##sig == 2);\
        info = EmitUnaryExpr(Js::OpCodeAsmJs::##asmjsop, WasmOpCodeSignatures::sig); \
        break;
#define WASM_EMPTY__OPCODE(opname, opcode, asmjsop, imp, wat) \
    case wb##opname: \
        m_writer->EmptyAsm(Js::OpCodeAsmJs::##asmjsop);\
        break;
#include "WasmBinaryOpCodes.h"
    default:
        throw WasmCompilationException(_u("Unknown expression's op 0x%X"), op);
    }

    PushEvalStack(info);
    DebugPrintOpEnd();
}